

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::predicted_have_piece
          (torrent *this,piece_index_t index,time_duration duration)

{
  const_iterator cVar1;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *psVar2;
  pointer pppVar3;
  peer_connection *this_00;
  const_iterator __position;
  ulong uVar4;
  ulong uVar5;
  pointer pppVar6;
  value_type local_3c;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  *local_38;
  
  cVar1._M_current =
       (this->m_predictive_pieces).
       super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->m_predictive_pieces).
           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)psVar2 - (long)cVar1._M_current >> 2;
  while (__position._M_current = cVar1._M_current, 0 < (long)uVar5) {
    uVar4 = uVar5 >> 1;
    uVar5 = ~uVar4 + uVar5;
    cVar1._M_current = __position._M_current + uVar4 + 1;
    if (index.m_val <= __position._M_current[uVar4].m_val) {
      cVar1._M_current = __position._M_current;
      uVar5 = uVar4;
    }
  }
  if ((__position._M_current == psVar2) || ((__position._M_current)->m_val != index.m_val)) {
    local_38 = &this->m_predictive_pieces;
    pppVar6 = (this->super_torrent_hot_members).m_connections.
              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              .
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pppVar3 = (this->super_torrent_hot_members).m_connections.
              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              .
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_3c.m_val = index.m_val;
    if (pppVar6 != pppVar3) {
      do {
        this_00 = *pppVar6;
        peer_connection::peer_log
                  (this_00,outgoing,"PREDICTIVE_HAVE","piece: %d expected in %d ms",
                   (ulong)(uint)local_3c.m_val,
                   (ulong)(uint)((int)(SUB168(SEXT816(duration.__r) * SEXT816(0x431bde82d7b634db),8)
                                      >> 0x12) -
                                (SUB164(SEXT816(duration.__r) * SEXT816(0x431bde82d7b634db),0xc) >>
                                0x1f)));
        peer_connection::announce_piece(this_00,(piece_index_t)local_3c.m_val);
        pppVar6 = pppVar6 + 1;
      } while (pppVar6 != pppVar3);
    }
    ::std::
    vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
    ::insert(local_38,__position,&local_3c);
  }
  return;
}

Assistant:

void torrent::predicted_have_piece(piece_index_t const index, time_duration const duration)
	{
		auto const i = std::lower_bound(m_predictive_pieces.begin()
			, m_predictive_pieces.end(), index);
		if (i != m_predictive_pieces.end() && *i == index) return;

		for (auto* p : m_connections)
		{
			TORRENT_INCREMENT(m_iterating_connections);
#ifndef TORRENT_DISABLE_LOGGING
			p->peer_log(peer_log_alert::outgoing, "PREDICTIVE_HAVE", "piece: %d expected in %d ms"
				, static_cast<int>(index), static_cast<int>(total_milliseconds(duration)));
#else
			TORRENT_UNUSED(duration);
#endif
			p->announce_piece(index);
		}

		m_predictive_pieces.insert(i, index);
	}